

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O0

DiskFileToVirtualFileResult __thiscall
google::protobuf::compiler::DiskSourceTree::DiskFileToVirtualFile
          (DiskSourceTree *this,string *disk_file,string *virtual_file,string *shadowing_disk_file)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  char *__name;
  ZeroCopyInputStream *p;
  scoped_ptr<google::protobuf::io::ZeroCopyInputStream> local_98;
  scoped_ptr<google::protobuf::io::ZeroCopyInputStream> stream;
  int i_1;
  int i;
  string local_78;
  undefined1 local_58 [8];
  string canonical_disk_file;
  int mapping_index;
  string *shadowing_disk_file_local;
  string *virtual_file_local;
  string *disk_file_local;
  DiskSourceTree *this_local;
  
  canonical_disk_file.field_2._12_4_ = 0xffffffff;
  std::__cxx11::string::string((string *)&local_78,(string *)disk_file);
  CanonicalizePath((string *)local_58,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  for (i_1 = 0; sVar3 = std::
                        vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
                        ::size(&this->mappings_), (ulong)(long)i_1 < sVar3; i_1 = i_1 + 1) {
    pvVar4 = std::
             vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
             ::operator[](&this->mappings_,(long)i_1);
    pvVar5 = std::
             vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
             ::operator[](&this->mappings_,(long)i_1);
    bVar1 = ApplyMapping((string *)local_58,&pvVar4->disk_path,&pvVar5->virtual_path,virtual_file);
    if (bVar1) {
      canonical_disk_file.field_2._12_4_ = i_1;
      break;
    }
  }
  if (canonical_disk_file.field_2._12_4_ == -1) {
    this_local._4_4_ = NO_MAPPING;
    stream.ptr_._4_4_ = 1;
  }
  else {
    for (stream.ptr_._0_4_ = 0; (int)stream.ptr_ < (int)canonical_disk_file.field_2._12_4_;
        stream.ptr_._0_4_ = (int)stream.ptr_ + 1) {
      pvVar4 = std::
               vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
               ::operator[](&this->mappings_,(long)(int)stream.ptr_);
      pvVar5 = std::
               vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
               ::operator[](&this->mappings_,(long)(int)stream.ptr_);
      bVar1 = ApplyMapping(virtual_file,&pvVar4->virtual_path,&pvVar5->disk_path,shadowing_disk_file
                          );
      if (bVar1) {
        __name = (char *)std::__cxx11::string::c_str();
        iVar2 = access(__name,0);
        if (-1 < iVar2) {
          this_local._4_4_ = SHADOWED;
          stream.ptr_._4_4_ = 1;
          goto LAB_002dcfba;
        }
      }
    }
    std::__cxx11::string::clear();
    p = OpenDiskFile(this,disk_file);
    internal::scoped_ptr<google::protobuf::io::ZeroCopyInputStream>::scoped_ptr(&local_98,p);
    bVar1 = internal::scoped_ptr<google::protobuf::io::ZeroCopyInputStream>::operator==
                      (&local_98,(ZeroCopyInputStream *)0x0);
    if (bVar1) {
      this_local._4_4_ = CANNOT_OPEN;
    }
    else {
      this_local._4_4_ = SUCCESS;
    }
    stream.ptr_._4_4_ = 1;
    internal::scoped_ptr<google::protobuf::io::ZeroCopyInputStream>::~scoped_ptr(&local_98);
  }
LAB_002dcfba:
  std::__cxx11::string::~string((string *)local_58);
  return this_local._4_4_;
}

Assistant:

DiskSourceTree::DiskFileToVirtualFileResult
DiskSourceTree::DiskFileToVirtualFile(
    const string& disk_file,
    string* virtual_file,
    string* shadowing_disk_file) {
  int mapping_index = -1;
  string canonical_disk_file = CanonicalizePath(disk_file);

  for (int i = 0; i < mappings_.size(); i++) {
    // Apply the mapping in reverse.
    if (ApplyMapping(canonical_disk_file, mappings_[i].disk_path,
                     mappings_[i].virtual_path, virtual_file)) {
      // Success.
      mapping_index = i;
      break;
    }
  }

  if (mapping_index == -1) {
    return NO_MAPPING;
  }

  // Iterate through all mappings with higher precedence and verify that none
  // of them map this file to some other existing file.
  for (int i = 0; i < mapping_index; i++) {
    if (ApplyMapping(*virtual_file, mappings_[i].virtual_path,
                     mappings_[i].disk_path, shadowing_disk_file)) {
      if (access(shadowing_disk_file->c_str(), F_OK) >= 0) {
        // File exists.
        return SHADOWED;
      }
    }
  }
  shadowing_disk_file->clear();

  // Verify that we can open the file.  Note that this also has the side-effect
  // of verifying that we are not canonicalizing away any non-existent
  // directories.
  scoped_ptr<io::ZeroCopyInputStream> stream(OpenDiskFile(disk_file));
  if (stream == NULL) {
    return CANNOT_OPEN;
  }

  return SUCCESS;
}